

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O2

void __thiscall
phyr::FilmTile::FilmTile
          (FilmTile *this,Bounds2i *pixelBounds,Vector2f *filterRadius,double *filterTable,
          int filterTableSize)

{
  Point2<int> PVar1;
  double dVar2;
  uint uVar3;
  size_type __n;
  Vector2f VVar4;
  allocator_type local_29;
  _Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_> local_28;
  
  PVar1 = pixelBounds->pMax;
  (this->pixelBounds).pMin = pixelBounds->pMin;
  (this->pixelBounds).pMax = PVar1;
  dVar2 = filterRadius->y;
  (this->filterRadius).x = filterRadius->x;
  (this->filterRadius).y = dVar2;
  VVar4 = (Vector2f)divpd(_DAT_001790e0,(undefined1  [16])*filterRadius);
  this->invFilterRadius = VVar4;
  this->filterTable = filterTable;
  this->filterTableSize = filterTableSize;
  (this->pixels).super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pixels).super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pixels).super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = Bounds2<int>::area(pixelBounds);
  __n = 0;
  if (0 < (int)uVar3) {
    __n = (size_type)uVar3;
  }
  std::vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>::vector
            ((vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_> *)&local_28,__n,
             &local_29);
  std::vector<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>::_M_move_assign
            (&this->pixels,&local_28);
  std::_Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>::~_Vector_base
            (&local_28);
  return;
}

Assistant:

FilmTile(const Bounds2i& pixelBounds, const Vector2f& filterRadius,
             const Real* filterTable, int filterTableSize) :
        pixelBounds(pixelBounds), filterRadius(filterRadius),
        invFilterRadius(Real(1) / filterRadius.x, Real(1) / filterRadius.y),
        filterTable(filterTable), filterTableSize(filterTableSize) {
        // Allocate pixels
        pixels = std::vector<FilmTilePixel>(std::max(0, pixelBounds.area()));
    }